

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O1

void __thiscall amrex::Amr::coarseTimeStep(Amr *this,Real stop_time)

{
  ostringstream *poVar1;
  double dVar2;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var3;
  pointer puVar4;
  pointer piVar5;
  bool bVar6;
  bool bVar7;
  Long LVar8;
  ostream *poVar9;
  FILE *pFVar10;
  long lVar11;
  bool bVar12;
  char *__filename;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar20;
  int iVar21;
  Long max_fab_kilobytes;
  Long min_fab_kilobytes;
  double local_348;
  undefined1 local_340 [24];
  undefined8 auStack_328 [46];
  stringstream stepName;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stepName);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"timeStep STEP ",0xe);
  std::ostream::operator<<
            (local_1a8,
             *(this->level_steps).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            );
  local_348 = second();
  _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (((this->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  if (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start < 1) {
    (**(code **)(*(long *)_Var3.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x68))
              (stop_time,
               _Var3.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
               *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
               this->sub_cycle,&this->n_cycle,
               &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&this->dt_level);
  }
  else {
    (**(code **)(*(long *)_Var3.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                          .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x70))
              (stop_time);
  }
  (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])(this->cumtime,stop_time,this,0,1,1);
  puVar4 = (this->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->cumtime =
       *(this->dt_level).super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       + this->cumtime;
  (**(code **)(*(long *)(puVar4->_M_t).
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
              + 0x88))();
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    dVar16 = second();
    iVar21 = *(this->level_steps).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    local_340._8_8_ = OutStream();
    poVar1 = (ostringstream *)(local_340 + 0x10);
    local_340._4_4_ = *(MPI_Comm *)(DAT_00756620 + -0x48);
    local_340._0_4_ = *(int *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_328 + *(long *)(local_340._16_8_ - 0x18)) =
         *(undefined8 *)(local_340._8_8_ + *(long *)(*(long *)local_340._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n[STEP ",7);
    std::ostream::operator<<(poVar1,iVar21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"] Coarse TimeStep time: ",0x18);
    std::ostream::_M_insert<double>(dVar16 - local_348);
    min_fab_kilobytes = CONCAT71(min_fab_kilobytes._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)&min_fab_kilobytes,1);
    Print::~Print((Print *)local_340);
    LVar8 = TotalBytesAllocatedInFabsHWM();
    lVar11 = LVar8 + 0x3ff;
    if (-1 < LVar8) {
      lVar11 = LVar8;
    }
    max_fab_kilobytes = lVar11 >> 10;
    min_fab_kilobytes = max_fab_kilobytes;
    ParallelDescriptor::ReduceLongMin(&min_fab_kilobytes,0);
    ParallelDescriptor::ReduceLongMax(&max_fab_kilobytes,0);
    local_340._8_8_ = OutStream();
    poVar1 = (ostringstream *)(local_340 + 0x10);
    local_340._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_340._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_328 + *(long *)(local_340._16_8_ - 0x18)) =
         *(undefined8 *)(local_340._8_8_ + *(long *)(*(long *)local_340._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"[STEP ",6);
    std::ostream::operator<<(poVar1,iVar21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"] FAB kilobyte spread across MPI nodes: [",0x29);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ... ",5);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]\n",2);
    Print::~Print((Print *)local_340);
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_340._8_8_ = OutStream();
    poVar1 = (ostringstream *)(local_340 + 0x10);
    local_340._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_340._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_328 + *(long *)(local_340._16_8_ - 0x18)) =
         *(undefined8 *)(local_340._8_8_ + *(long *)(*(long *)local_340._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\nSTEP = ",8);
    std::ostream::operator<<
              (poVar1,*(this->level_steps).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," TIME = ",8);
    std::ostream::_M_insert<double>(this->cumtime);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," DT = ",6);
    std::ostream::_M_insert<double>
              (*(this->dt_level).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\n",2);
    Print::~Print((Print *)local_340);
  }
  if ((this->record_run_info != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->runlog,"STEP = ",7);
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (&this->runlog,
                        *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," TIME = ",8);
    poVar9 = std::ostream::_M_insert<double>(this->cumtime);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," DT = ",6);
    poVar9 = std::ostream::_M_insert<double>
                       (*(this->dt_level).super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_340[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_340,1);
  }
  if ((this->record_run_info_terse != 0) && (*(int *)(ParallelContext::frames + 0xc) == 0)) {
    poVar9 = (ostream *)
             std::ostream::operator<<
                       (&this->runlog_terse,
                        *(this->level_steps).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::ostream::_M_insert<double>(this->cumtime);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::ostream::_M_insert<double>
                       (*(this->dt_level).super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_340[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_340,1);
  }
  dVar16 = this->check_per;
  bVar6 = false;
  bVar13 = false;
  if (0.0 < dVar16) {
    dVar2 = this->cumtime;
    dVar17 = dVar2 - *(this->dt_level).super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
    auVar18._8_8_ = dVar17;
    auVar18._0_8_ = dVar2;
    auVar19._8_4_ = SUB84(dVar16,0);
    auVar19._0_8_ = dVar16;
    auVar19._12_4_ = (int)((ulong)dVar16 >> 0x20);
    auVar19 = divpd(auVar18,auVar19);
    iVar20 = (int)auVar19._0_8_;
    iVar21 = (int)auVar19._8_8_;
    dVar16 = (double)(iVar21 + 1) * dVar16;
    if ((iVar20 == iVar21) && (ABS(dVar2 - dVar16) <= ABS(dVar2) * 2.220446049250313e-15)) {
      iVar20 = iVar20 + 1;
    }
    if ((iVar20 != iVar21) && (ABS(dVar17 - dVar16) <= ABS(dVar2) * 2.220446049250313e-15)) {
      iVar21 = iVar21 + 1;
    }
    bVar13 = iVar21 != iVar20;
  }
  bVar7 = true;
  if (this->message_int < 1) {
    bVar14 = false;
    bVar15 = false;
  }
  else {
    bVar6 = false;
    bVar14 = false;
    bVar15 = false;
    if (*(this->level_steps).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
        this->message_int == 0) {
      bVar6 = false;
      bVar7 = false;
      bVar14 = false;
      bVar15 = false;
      if (*(int *)(ParallelContext::frames + 0xc) == 0) {
        __filename = "dump_and_continue";
        pFVar10 = fopen("dump_and_continue","r");
        if (pFVar10 == (FILE *)0x0) {
          __filename = "stop_run";
          pFVar10 = fopen("stop_run","r");
          if (pFVar10 != (FILE *)0x0) {
            bVar7 = false;
            bVar6 = true;
            goto LAB_004edd71;
          }
          __filename = "dump_and_stop";
          pFVar10 = fopen("dump_and_stop","r");
          if (pFVar10 != (FILE *)0x0) {
            bVar6 = true;
            bVar7 = true;
            goto LAB_004edd71;
          }
          bVar6 = false;
          bVar7 = false;
        }
        else {
          bVar7 = true;
          bVar6 = false;
LAB_004edd71:
          remove(__filename);
          fclose(pFVar10);
        }
        pFVar10 = fopen("plot_and_continue","r");
        bVar14 = pFVar10 != (FILE *)0x0;
        if (bVar14) {
          remove("plot_and_continue");
          fclose(pFVar10);
        }
        pFVar10 = fopen("small_plot_and_continue","r");
        bVar15 = pFVar10 != (FILE *)0x0;
        if (bVar15) {
          remove("small_plot_and_continue");
          fclose(pFVar10);
        }
      }
      bVar7 = !bVar7;
    }
  }
  bVar12 = (bool)(bVar7 ^ 1);
  if (bVar6 && !bVar12) {
    piVar5 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    this->last_checkpoint = *piVar5;
    this->last_plotfile = *piVar5;
  }
  iVar21 = this->write_plotfile_with_checkpoint;
  if (this->check_int < 1) {
    if (!(bool)(bVar13 | bVar12)) goto LAB_004ede68;
  }
  else if ((!bVar13 && !bVar12) &&
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start %
           this->check_int != 0) goto LAB_004ede68;
  (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])(this);
LAB_004ede68:
  bVar13 = writePlotNow(this);
  bVar12 = (bool)((iVar21 == 0 | bVar7) ^ 1);
  if ((bVar13) || (bVar14 || bVar12)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  bVar13 = writeSmallPlotNow(this);
  if ((bVar13) || (bVar15 || bVar12)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xe])(this);
  }
  this->bUserStopRequest = bVar6;
  if (bVar6) {
    local_340._0_8_ = local_340 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_340,"Amr::coarseTimeStep::to_stop","");
    ParallelDescriptor::Barrier((string *)local_340);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_,local_340._16_8_ + 1);
    }
    if (*(int *)(ParallelContext::frames + 0xc) == 0) {
      if (bVar7) {
        poVar9 = ErrorStream();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Stopped by user w/o checkpoint",0x1e);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      }
      else {
        poVar9 = ErrorStream();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Stopped by user w/ checkpoint",0x1d);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      }
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&stepName);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void
Amr::coarseTimeStep (Real stop_time)
{
    double run_stop;
    double run_strt;
    BL_PROFILE_REGION_START("Amr::coarseTimeStep()");
    BL_PROFILE("Amr::coarseTimeStep()");
    std::stringstream stepName;
    stepName << "timeStep STEP " << level_steps[0];

    run_strt = amrex::second() ;

    //
    // Compute new dt.
    //
    if (levelSteps(0) > 0)
    {
        int post_regrid_flag = 0;
        amr_level[0]->computeNewDt(finest_level,
                                   sub_cycle,
                                   n_cycle,
                                   ref_ratio,
                                   dt_min,
                                   dt_level,
                                   stop_time,
                                   post_regrid_flag);
    }
    else
    {
        amr_level[0]->computeInitialDt(finest_level,
                                       sub_cycle,
                                       n_cycle,
                                       ref_ratio,
                                       dt_level,
                                       stop_time);
    }

    BL_PROFILE_REGION_START(stepName.str());
    timeStep(0,cumtime,1,1,stop_time);
    BL_PROFILE_REGION_STOP(stepName.str());

    cumtime += dt_level[0];

    amr_level[0]->postCoarseTimeStep(cumtime);


    if (verbose > 0)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        run_stop = amrex::second() - run_strt;
        const int istep    = level_steps[0];

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(run_stop,IOProc);
            amrex::Print() << "\n[STEP " << istep << "] Coarse TimeStep time: " << run_stop << '\n';
#ifdef BL_LAZY
        });
#endif

#ifndef AMREX_MEM_PROFILING
        Long min_fab_kilobytes  = amrex::TotalBytesAllocatedInFabsHWM()/1024;
        Long max_fab_kilobytes  = min_fab_kilobytes;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceLongMin(min_fab_kilobytes, IOProc);
            ParallelDescriptor::ReduceLongMax(max_fab_kilobytes, IOProc);

            amrex::Print() << "[STEP " << istep << "] FAB kilobyte spread across MPI nodes: ["
                           << min_fab_kilobytes << " ... " << max_fab_kilobytes << "]\n";
#ifdef BL_LAZY
            amrex::Print() << "\n";
            });
#endif
#endif
    }

#ifdef AMREX_MEM_PROFILING
    {
        std::ostringstream ss;
        ss << "[STEP " << level_steps[0] << "]";
        MemProfiler::report(ss.str());
    }
#endif

    BL_PROFILE_ADD_STEP(level_steps[0]);
    BL_PROFILE_REGION_STOP("Amr::coarseTimeStep()");
    BL_COMM_PROFILE_NAMETAG(stepName.str());
    //BL_PROFILE_FLUSH();
    BL_TRACE_PROFILE_FLUSH();
    BL_COMM_PROFILE_FLUSH();

    if (verbose > 0)
    {
        amrex::Print()
            << "\nSTEP = " << level_steps[0]
            << " TIME = "  << cumtime
            << " DT = "    << dt_level[0] << "\n\n";
    }
    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "STEP = "  << level_steps[0]
               << " TIME = " << cumtime
               << " DT = "   << dt_level[0] << '\n';
    }
    if (record_run_info_terse && ParallelDescriptor::IOProcessor())
        runlog_terse << level_steps[0] << " " << cumtime << " " << dt_level[0] << '\n';

    int check_test = 0;

    if (check_per > 0.0)
    {

        // Check to see if we've crossed a check_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.

        int num_per_old = static_cast<int>((cumtime-dt_level[0]) / check_per);
        int num_per_new = static_cast<int>((cumtime            ) / check_per);

        // Before using these, however, we must test for the case where we're
        // within machine epsilon of the next interval. In that case, increment
        // the counter, because we have indeed reached the next check_per interval
        // at this point.

        const Real eps = std::numeric_limits<Real>::epsilon() * 10.0_rt * std::abs(cumtime);
        const Real next_chk_time = (num_per_old + 1) * check_per;

        if ((num_per_new == num_per_old) && std::abs(cumtime - next_chk_time) <= eps)
        {
            num_per_new += 1;
        }

        // Similarly, we have to account for the case where the old time is within
        // machine epsilon of the beginning of this interval, so that we don't double
        // count that time threshold -- we already plotted at that time on the last timestep.

        if ((num_per_new != num_per_old) && std::abs((cumtime - dt_level[0]) - next_chk_time) <= eps)
        {
            num_per_old += 1;
        }

        if (num_per_old != num_per_new)
        {
            check_test = 1;
        }

    }

    int to_stop       = 0;
    int to_checkpoint = 0;
    int to_plot       = 0;
    int to_small_plot = 0;
    if (message_int > 0 && level_steps[0] % message_int == 0) {
        if (ParallelDescriptor::IOProcessor())
        {
            FILE *fp;
            if ((fp=fopen("dump_and_continue","r")) != 0)
            {
                remove("dump_and_continue");
                to_checkpoint = 1;
                fclose(fp);
            }
            else if ((fp=fopen("stop_run","r")) != 0)
            {
                remove("stop_run");
                to_stop = 1;
                fclose(fp);
            }
            else if ((fp=fopen("dump_and_stop","r")) != 0)
            {
                remove("dump_and_stop");
                to_checkpoint = 1;
                to_stop = 1;
                fclose(fp);
            }

            if ((fp=fopen("plot_and_continue","r")) != 0)
            {
                remove("plot_and_continue");
                to_plot = 1;
                fclose(fp);
            }

            if ((fp=fopen("small_plot_and_continue","r")) != 0)
            {
                remove("small_plot_and_continue");
                to_small_plot = 1;
                fclose(fp);
            }
        }
        int packed_data[4];
        packed_data[0] = to_stop;
        packed_data[1] = to_checkpoint;
        packed_data[2] = to_plot;
        packed_data[3] = to_small_plot;
        ParallelDescriptor::Bcast(packed_data, 4, ParallelDescriptor::IOProcessorNumber());
        to_stop = packed_data[0];
        to_checkpoint = packed_data[1];
        to_plot = packed_data[2];
        to_small_plot = packed_data[3];

    }

    if(to_stop == 1 && to_checkpoint == 0) {  // prevent main from writing files
        last_checkpoint = level_steps[0];
        last_plotfile   = level_steps[0];
    }

    if (to_checkpoint && write_plotfile_with_checkpoint) {
        to_plot = 1;
        to_small_plot = 1;
    }

    if ((check_int > 0 && level_steps[0] % check_int == 0) || check_test == 1
        || to_checkpoint)
    {
        checkPoint();
    }


    if (writePlotNow() || to_plot)
    {
        writePlotFile();
    }

    if (writeSmallPlotNow() || to_small_plot)
    {
        writeSmallPlotFile();
    }

    updateInSitu();

    bUserStopRequest = to_stop;
    if (to_stop)
    {
        ParallelDescriptor::Barrier("Amr::coarseTimeStep::to_stop");
        if(ParallelDescriptor::IOProcessor()) {
            if (to_checkpoint)
            {
                amrex::ErrorStream() << "Stopped by user w/ checkpoint" << std::endl;
            }
            else
            {
                amrex::ErrorStream() << "Stopped by user w/o checkpoint" << std::endl;
            }
        }
    }
}